

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringSerialiser.cpp
# Opt level: O0

void __thiscall
Utility::StringSerialiser::StringSerialiser
          (StringSerialiser *this,string *source,bool use_linefeed_only)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  bool bVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char character;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  bool saw_carriage_return;
  bool use_linefeed_only_local;
  string *source_local;
  StringSerialiser *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->input_string_pointer_ = 0;
  if (use_linefeed_only) {
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)this);
    bVar4 = false;
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_48._M_current = (char *)std::__cxx11::string::end();
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8), bVar2) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      cVar1 = *pcVar3;
      if (cVar1 == '\n') {
        if (!bVar4) {
          std::__cxx11::string::push_back((char)this);
        }
      }
      else {
        std::__cxx11::string::push_back((char)this);
      }
      bVar4 = cVar1 == '\r';
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)this,(string *)source);
  }
  return;
}

Assistant:

StringSerialiser::StringSerialiser(const std::string &source, bool use_linefeed_only) {
	if(!use_linefeed_only) {
		input_string_ = source;
	} else {
		input_string_.reserve(source.size());

		// Commute any \ns that are not immediately after \rs to \rs; remove the rest.
		bool saw_carriage_return = false;
		for(auto character: source) {
			if(character != '\n') {
				input_string_.push_back(character);
			} else {
				if(!saw_carriage_return) {
					input_string_.push_back('\r');
				}
			}
			saw_carriage_return = character == '\r';
		}
	}
}